

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3SrcListFuncArgs(Parse *pParse,SrcList *p,ExprList *pList)

{
  undefined1 *puVar1;
  int iVar2;
  
  if (p != (SrcList *)0x0) {
    iVar2 = p->nSrc;
    p->a[(long)iVar2 + -1].u1.pFuncArg = pList;
    puVar1 = &p->a[(long)iVar2 + -1].fg.field_0x1;
    *puVar1 = *puVar1 | 4;
    return;
  }
  sqlite3ExprListDelete(pParse->db,pList);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListFuncArgs(Parse *pParse, SrcList *p, ExprList *pList){
  if( p ){
    struct SrcList_item *pItem = &p->a[p->nSrc-1];
    assert( pItem->fg.notIndexed==0 );
    assert( pItem->fg.isIndexedBy==0 );
    assert( pItem->fg.isTabFunc==0 );
    pItem->u1.pFuncArg = pList;
    pItem->fg.isTabFunc = 1;
  }else{
    sqlite3ExprListDelete(pParse->db, pList);
  }
}